

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseAssign.h
# Opt level: O1

void Eigen::internal::
     assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,int>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::SparseMatrix<double,0,int>const,Eigen::SparseMatrix<double,0,int>const>>
               (SparseMatrix<double,_0,_int> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
               *src)

{
  StorageIndex SVar1;
  LhsNested pSVar2;
  RhsNested pSVar3;
  Scalar *pSVar4;
  StorageIndex *pSVar5;
  Scalar *pSVar6;
  StorageIndex *pSVar7;
  Scalar *pSVar8;
  StorageIndex *pSVar9;
  bool bVar10;
  Index IVar11;
  StorageIndex *pSVar12;
  Index IVar13;
  Index IVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  Index IVar23;
  long lVar24;
  int iVar27;
  Scalar SVar25;
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar31;
  undefined1 auVar30 [16];
  Scalar v;
  Scalar local_b8;
  long local_b0;
  SparseMatrix<double,_0,_int> local_78;
  
  pSVar2 = src->m_lhs;
  pSVar3 = src->m_rhs;
  IVar23 = pSVar3->m_outerSize;
  if ((src->
      super_CwiseBinaryOpImpl<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>,_Eigen::Sparse>
      ).
      super_SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
      .m_isRValue == true) {
    SparseMatrix<double,_0,_int>::resize(dst,pSVar3->m_innerSize,IVar23);
    (dst->m_data).m_size = 0;
    memset(dst->m_outerIndex,0,dst->m_outerSize * 4 + 4);
    if (dst->m_innerNonZeros != (StorageIndex *)0x0) {
      memset(dst->m_innerNonZeros,0,dst->m_outerSize << 2);
    }
    lVar21 = src->m_rhs->m_outerSize;
    lVar18 = src->m_rhs->m_innerSize;
    if (lVar21 < lVar18) {
      lVar21 = lVar18;
    }
    CompressedStorage<double,_int>::reserve(&dst->m_data,lVar21 * 2);
    if (0 < IVar23) {
      lVar21 = 0;
      do {
        dst->m_outerIndex[lVar21 + 1] = dst->m_outerIndex[lVar21];
        local_b0 = (long)pSVar2->m_outerIndex[lVar21];
        if (pSVar2->m_innerNonZeros == (StorageIndex *)0x0) {
          lVar18 = (long)pSVar2->m_outerIndex[lVar21 + 1];
        }
        else {
          lVar18 = pSVar2->m_innerNonZeros[lVar21] + local_b0;
        }
        pSVar4 = (pSVar2->m_data).m_values;
        pSVar5 = (pSVar2->m_data).m_indices;
        pSVar6 = (pSVar3->m_data).m_values;
        pSVar7 = (pSVar3->m_data).m_indices;
        lVar24 = (long)pSVar3->m_outerIndex[lVar21];
        if (pSVar3->m_innerNonZeros == (StorageIndex *)0x0) {
          lVar19 = (long)pSVar3->m_outerIndex[lVar21 + 1];
        }
        else {
          lVar19 = pSVar3->m_innerNonZeros[lVar21] + lVar24;
        }
        if (lVar18 <= local_b0) {
LAB_00143537:
          if (lVar19 <= lVar24) goto LAB_001436bd;
          goto joined_r0x00143550;
        }
        if (lVar24 < lVar19) {
          iVar27 = pSVar5[local_b0];
          if (iVar27 == pSVar7[lVar24]) {
            local_b8 = pSVar4[local_b0] + pSVar6[lVar24];
            local_b0 = local_b0 + 1;
            goto LAB_0014355b;
          }
          if (pSVar7[lVar24] <= iVar27) goto LAB_00143537;
        }
        iVar27 = pSVar5[local_b0];
        local_b8 = pSVar4[local_b0] + 0.0;
        local_b0 = local_b0 + 1;
LAB_0014356d:
        if (-1 < iVar27) {
          iVar31 = dst->m_outerIndex[lVar21 + 1];
          dst->m_outerIndex[lVar21 + 1] = iVar31 + 1;
          lVar20 = (dst->m_data).m_size;
          CompressedStorage<double,_int>::resize(&dst->m_data,lVar20 + 1,1.0);
          pSVar8 = (dst->m_data).m_values;
          pSVar8[lVar20] = 0.0;
          (dst->m_data).m_indices[lVar20] = iVar27;
          pSVar8[iVar31] = local_b8;
          if (local_b0 < lVar18) {
            if (lVar24 < lVar19) {
              iVar27 = pSVar5[local_b0];
              if (iVar27 == pSVar7[lVar24]) {
                local_b8 = pSVar4[local_b0] + pSVar6[lVar24];
                local_b0 = local_b0 + 1;
                lVar24 = lVar24 + 1;
                goto LAB_0014356d;
              }
              if ((lVar24 < lVar19) && (pSVar7[lVar24] <= pSVar5[local_b0])) goto LAB_00143669;
            }
            iVar27 = pSVar5[local_b0];
            local_b8 = pSVar4[local_b0] + 0.0;
            local_b0 = local_b0 + 1;
            goto LAB_0014356d;
          }
LAB_00143669:
          iVar27 = -1;
          if (lVar24 < lVar19) {
joined_r0x00143550:
            if ((local_b0 < lVar18) && (pSVar5[local_b0] <= pSVar7[lVar24])) {
LAB_001436bd:
              iVar27 = -1;
              local_b8 = 0.0;
            }
            else {
              iVar27 = pSVar7[lVar24];
              local_b8 = pSVar6[lVar24] + 0.0;
LAB_0014355b:
              lVar24 = lVar24 + 1;
            }
          }
          else {
            local_b8 = 0.0;
          }
          goto LAB_0014356d;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != IVar23);
    }
    auVar17 = _DAT_0019b840;
    auVar16 = _DAT_0019b830;
    auVar15 = _DAT_0019b820;
    if (dst->m_innerNonZeros == (StorageIndex *)0x0) {
      lVar21 = dst->m_outerSize;
      lVar18 = lVar21;
      if (-1 < lVar21) {
        do {
          if (dst->m_outerIndex[lVar18] != 0) goto LAB_00143711;
          bVar10 = 0 < lVar18;
          lVar18 = lVar18 + -1;
        } while (bVar10);
        lVar18 = -1;
      }
LAB_00143711:
      lVar24 = lVar21 - lVar18;
      if (lVar24 != 0 && lVar18 <= lVar21) {
        SVar1 = (StorageIndex)(dst->m_data).m_size;
        pSVar9 = dst->m_outerIndex;
        lVar21 = lVar24 + -1;
        auVar26._8_4_ = (int)lVar21;
        auVar26._0_8_ = lVar21;
        auVar26._12_4_ = (int)((ulong)lVar21 >> 0x20);
        uVar22 = 0;
        auVar26 = auVar26 ^ _DAT_0019b840;
        do {
          auVar28._8_4_ = (int)uVar22;
          auVar28._0_8_ = uVar22;
          auVar28._12_4_ = (int)(uVar22 >> 0x20);
          auVar30 = (auVar28 | auVar16) ^ auVar17;
          iVar27 = auVar26._4_4_;
          if ((bool)(~(auVar30._4_4_ == iVar27 && auVar26._0_4_ < auVar30._0_4_ ||
                      iVar27 < auVar30._4_4_) & 1)) {
            pSVar9[lVar18 + uVar22 + 1] = SVar1;
          }
          if ((auVar30._12_4_ != auVar26._12_4_ || auVar30._8_4_ <= auVar26._8_4_) &&
              auVar30._12_4_ <= auVar26._12_4_) {
            pSVar9[lVar18 + uVar22 + 2] = SVar1;
          }
          auVar30 = (auVar28 | auVar15) ^ auVar17;
          iVar31 = auVar30._4_4_;
          if (iVar31 <= iVar27 && (iVar31 != iVar27 || auVar30._0_4_ <= auVar26._0_4_)) {
            pSVar9[lVar18 + uVar22 + 3] = SVar1;
            pSVar9[lVar18 + uVar22 + 4] = SVar1;
          }
          uVar22 = uVar22 + 4;
        } while ((lVar24 + 3U & 0xfffffffffffffffc) != uVar22);
      }
    }
  }
  else {
    local_78.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
    local_78.m_outerSize = 0;
    local_78.m_innerSize = 0;
    local_78.m_outerIndex = (StorageIndex *)0x0;
    local_78.m_innerNonZeros = (StorageIndex *)0x0;
    local_78.m_data.m_values = (Scalar *)0x0;
    local_78.m_data.m_indices = (StorageIndex *)0x0;
    local_78.m_data.m_size = 0;
    local_78.m_data.m_allocatedSize = 0;
    SparseMatrix<double,_0,_int>::resize(&local_78,pSVar3->m_innerSize,pSVar3->m_outerSize);
    lVar21 = src->m_rhs->m_outerSize;
    lVar18 = src->m_rhs->m_innerSize;
    if (lVar21 < lVar18) {
      lVar21 = lVar18;
    }
    CompressedStorage<double,_int>::reserve(&local_78.m_data,lVar21 * 2);
    if (0 < IVar23) {
      lVar21 = 0;
LAB_00143873:
      local_78.m_outerIndex[lVar21 + 1] = local_78.m_outerIndex[lVar21];
      lVar18 = (long)pSVar2->m_outerIndex[lVar21];
      if (pSVar2->m_innerNonZeros == (StorageIndex *)0x0) {
        lVar24 = (long)pSVar2->m_outerIndex[lVar21 + 1];
      }
      else {
        lVar24 = pSVar2->m_innerNonZeros[lVar21] + lVar18;
      }
      pSVar4 = (pSVar2->m_data).m_values;
      pSVar5 = (pSVar2->m_data).m_indices;
      pSVar6 = (pSVar3->m_data).m_values;
      pSVar7 = (pSVar3->m_data).m_indices;
      lVar19 = (long)pSVar3->m_outerIndex[lVar21];
      if (pSVar3->m_innerNonZeros == (StorageIndex *)0x0) {
        lVar20 = (long)pSVar3->m_outerIndex[lVar21 + 1];
      }
      else {
        lVar20 = pSVar3->m_innerNonZeros[lVar21] + lVar19;
      }
      if (lVar18 < lVar24) {
        if (lVar20 <= lVar19) goto LAB_0014392d;
        iVar27 = pSVar5[lVar18];
        if (iVar27 == pSVar7[lVar19]) goto LAB_00143910;
        if (iVar27 < pSVar7[lVar19]) goto LAB_0014392d;
      }
      iVar27 = -1;
      SVar25 = 0.0;
      if (lVar20 <= lVar19) goto LAB_00143970;
      if (lVar18 < lVar24) goto LAB_00143a40;
LAB_00143a57:
      iVar27 = pSVar7[lVar19];
      SVar25 = pSVar6[lVar19] + 0.0;
LAB_0014396d:
      lVar19 = lVar19 + 1;
LAB_00143970:
      do {
        while( true ) {
          IVar11 = local_78.m_data.m_size;
          if (iVar27 < 0) {
            lVar21 = lVar21 + 1;
            if (lVar21 == IVar23) goto LAB_00143a8b;
            goto LAB_00143873;
          }
          iVar31 = local_78.m_outerIndex[lVar21 + 1];
          local_78.m_outerIndex[lVar21 + 1] = iVar31 + 1;
          CompressedStorage<double,_int>::resize(&local_78.m_data,local_78.m_data.m_size + 1,1.0);
          local_78.m_data.m_values[IVar11] = 0.0;
          local_78.m_data.m_indices[IVar11] = iVar27;
          local_78.m_data.m_values[iVar31] = SVar25;
          if (lVar18 < lVar24) break;
LAB_00143a25:
          iVar27 = -1;
          SVar25 = 0.0;
          if (lVar19 < lVar20) {
            if (lVar24 <= lVar18) goto LAB_00143a57;
LAB_00143a40:
            SVar25 = 0.0;
            iVar27 = -1;
            if (pSVar7[lVar19] < pSVar5[lVar18]) goto LAB_00143a57;
          }
        }
        if (lVar19 < lVar20) {
          iVar27 = pSVar5[lVar18];
          if (iVar27 == pSVar7[lVar19]) goto LAB_00143910;
          if ((lVar19 < lVar20) && (pSVar7[lVar19] <= pSVar5[lVar18])) goto LAB_00143a25;
        }
LAB_0014392d:
        iVar27 = pSVar5[lVar18];
        SVar25 = pSVar4[lVar18] + 0.0;
        lVar18 = lVar18 + 1;
      } while( true );
    }
LAB_00143a8b:
    auVar17 = _DAT_0019b840;
    auVar16 = _DAT_0019b830;
    auVar15 = _DAT_0019b820;
    if (local_78.m_innerNonZeros == (StorageIndex *)0x0) {
      IVar23 = local_78.m_outerSize;
      if (-1 < local_78.m_outerSize) {
        do {
          if (local_78.m_outerIndex[IVar23] != 0) goto LAB_00143aca;
          bVar10 = 0 < IVar23;
          IVar23 = IVar23 + -1;
        } while (bVar10);
        IVar23 = -1;
      }
LAB_00143aca:
      lVar21 = local_78.m_outerSize - IVar23;
      if (lVar21 != 0 && IVar23 <= local_78.m_outerSize) {
        lVar18 = lVar21 + -1;
        auVar30._8_4_ = (int)lVar18;
        auVar30._0_8_ = lVar18;
        auVar30._12_4_ = (int)((ulong)lVar18 >> 0x20);
        uVar22 = 0;
        auVar30 = auVar30 ^ _DAT_0019b840;
        do {
          auVar29._8_4_ = (int)uVar22;
          auVar29._0_8_ = uVar22;
          auVar29._12_4_ = (int)(uVar22 >> 0x20);
          auVar26 = (auVar29 | auVar16) ^ auVar17;
          iVar27 = auVar30._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar27 && auVar30._0_4_ < auVar26._0_4_ ||
                      iVar27 < auVar26._4_4_) & 1)) {
            local_78.m_outerIndex[IVar23 + uVar22 + 1] = (StorageIndex)local_78.m_data.m_size;
          }
          if ((auVar26._12_4_ != auVar30._12_4_ || auVar26._8_4_ <= auVar30._8_4_) &&
              auVar26._12_4_ <= auVar30._12_4_) {
            local_78.m_outerIndex[IVar23 + uVar22 + 2] = (StorageIndex)local_78.m_data.m_size;
          }
          auVar29 = (auVar29 | auVar15) ^ auVar17;
          iVar31 = auVar29._4_4_;
          if (iVar31 <= iVar27 && (iVar31 != iVar27 || auVar29._0_4_ <= auVar30._0_4_)) {
            local_78.m_outerIndex[IVar23 + uVar22 + 3] = (StorageIndex)local_78.m_data.m_size;
            local_78.m_outerIndex[IVar23 + uVar22 + 4] = (StorageIndex)local_78.m_data.m_size;
          }
          uVar22 = uVar22 + 4;
        } while ((lVar21 + 3U & 0xfffffffffffffffc) != uVar22);
      }
    }
    local_78.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)true;
    IVar23 = dst->m_outerSize;
    IVar11 = dst->m_innerSize;
    dst->m_outerSize = local_78.m_outerSize;
    dst->m_innerSize = local_78.m_innerSize;
    pSVar9 = dst->m_outerIndex;
    pSVar12 = dst->m_innerNonZeros;
    dst->m_outerIndex = local_78.m_outerIndex;
    dst->m_innerNonZeros = local_78.m_innerNonZeros;
    pSVar4 = (dst->m_data).m_values;
    pSVar5 = (dst->m_data).m_indices;
    (dst->m_data).m_values = local_78.m_data.m_values;
    (dst->m_data).m_indices = local_78.m_data.m_indices;
    IVar13 = (dst->m_data).m_size;
    IVar14 = (dst->m_data).m_allocatedSize;
    (dst->m_data).m_size = local_78.m_data.m_size;
    (dst->m_data).m_allocatedSize = local_78.m_data.m_allocatedSize;
    local_78.m_outerSize = IVar23;
    local_78.m_innerSize = IVar11;
    local_78.m_outerIndex = pSVar9;
    local_78.m_innerNonZeros = pSVar12;
    local_78.m_data.m_values = pSVar4;
    local_78.m_data.m_indices = pSVar5;
    local_78.m_data.m_size = IVar13;
    local_78.m_data.m_allocatedSize = IVar14;
    free(pSVar9);
    free(local_78.m_innerNonZeros);
    CompressedStorage<double,_int>::~CompressedStorage(&local_78.m_data);
  }
  return;
LAB_00143910:
  SVar25 = pSVar4[lVar18] + pSVar6[lVar19];
  lVar18 = lVar18 + 1;
  goto LAB_0014396d;
}

Assistant:

void assign_sparse_to_sparse(DstXprType &dst, const SrcXprType &src)
{
  typedef typename DstXprType::Scalar Scalar;
  typedef internal::evaluator<DstXprType> DstEvaluatorType;
  typedef internal::evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  const bool transpose = (DstEvaluatorType::Flags & RowMajorBit) != (SrcEvaluatorType::Flags & RowMajorBit);
  const Index outerEvaluationSize = (SrcEvaluatorType::Flags&RowMajorBit) ? src.rows() : src.cols();
  if ((!transpose) && src.isRValue())
  {
    // eval without temporary
    dst.resize(src.rows(), src.cols());
    dst.setZero();
    dst.reserve((std::max)(src.rows(),src.cols())*2);
    for (Index j=0; j<outerEvaluationSize; ++j)
    {
      dst.startVec(j);
      for (typename SrcEvaluatorType::InnerIterator it(srcEvaluator, j); it; ++it)
      {
        Scalar v = it.value();
        dst.insertBackByOuterInner(j,it.index()) = v;
      }
    }
    dst.finalize();
  }
  else
  {
    // eval through a temporary
    eigen_assert(( ((internal::traits<DstXprType>::SupportedAccessPatterns & OuterRandomAccessPattern)==OuterRandomAccessPattern) ||
              (!((DstEvaluatorType::Flags & RowMajorBit) != (SrcEvaluatorType::Flags & RowMajorBit)))) &&
              "the transpose operation is supposed to be handled in SparseMatrix::operator=");

    enum { Flip = (DstEvaluatorType::Flags & RowMajorBit) != (SrcEvaluatorType::Flags & RowMajorBit) };

    
    DstXprType temp(src.rows(), src.cols());

    temp.reserve((std::max)(src.rows(),src.cols())*2);
    for (Index j=0; j<outerEvaluationSize; ++j)
    {
      temp.startVec(j);
      for (typename SrcEvaluatorType::InnerIterator it(srcEvaluator, j); it; ++it)
      {
        Scalar v = it.value();
        temp.insertBackByOuterInner(Flip?it.index():j,Flip?j:it.index()) = v;
      }
    }
    temp.finalize();

    dst = temp.markAsRValue();
  }
}